

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O3

void COLLADABU::Math::Quaternion::intermediate
               (Quaternion *rkQ0,Quaternion *rkQ1,Quaternion *rkQ2,Quaternion *rkA,Quaternion *rkB)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  Quaternion local_70;
  Quaternion local_50;
  
  dVar7 = log(&local_50,rkQ1->z * rkQ2->z);
  log(&local_70,dVar7);
  dVar11 = (local_50.x - local_70.x) * 0.25;
  dVar7 = -dVar11;
  dVar18 = (local_50.y - local_70.y) * 0.25;
  dVar19 = (local_50.z - local_70.z) * 0.25;
  dVar8 = SQRT(dVar19 * dVar19 + dVar11 * dVar11 + dVar18 * dVar18);
  dVar9 = sin(dVar8);
  dVar10 = cos(dVar8);
  dVar12 = dVar9 / dVar8;
  if (ABS(dVar9) >= 0.001) {
    dVar11 = dVar11 * dVar12;
  }
  uVar6 = (uint)(ABS(dVar9) < 0.001);
  auVar14._0_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
  auVar14._4_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
  auVar14._8_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
  auVar14._12_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
  auVar5._8_8_ = dVar19;
  auVar5._0_8_ = dVar18;
  auVar15._8_8_ = dVar12 * dVar19;
  auVar15._0_8_ = dVar12 * dVar18;
  auVar15 = ~auVar14 & auVar15 | auVar5 & auVar14;
  dVar17 = rkQ1->w;
  dVar1 = rkQ1->x;
  dVar2 = rkQ1->y;
  dVar3 = rkQ1->y;
  dVar4 = rkQ1->z;
  dVar9 = rkQ1->z;
  dVar12 = auVar15._8_8_;
  dVar13 = auVar15._0_8_;
  rkA->w = (-dVar2 * dVar13 + dVar10 * dVar17 + -dVar1 * dVar11) - dVar9 * dVar12;
  rkA->x = (dVar2 * dVar12 + dVar11 * dVar17 + dVar1 * dVar10) - dVar9 * dVar13;
  rkA->y = (dVar11 * dVar9 + dVar17 * dVar13 + dVar10 * dVar3) - dVar12 * dVar1;
  rkA->z = (dVar13 * dVar1 + dVar17 * dVar12 + dVar10 * dVar4) - dVar11 * dVar2;
  dVar9 = sin(dVar8);
  dVar10 = cos(dVar8);
  dVar8 = dVar9 / dVar8;
  if (ABS(dVar9) >= 0.001) {
    dVar7 = dVar7 * dVar8;
  }
  uVar6 = (uint)(ABS(dVar9) < 0.001);
  auVar16._0_8_ = CONCAT44((int)(uVar6 << 0x1f) >> 0x1f,(int)(uVar6 << 0x1f) >> 0x1f);
  auVar16._8_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
  auVar16._12_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
  dVar13 = (double)(~auVar16._0_8_ & (ulong)(dVar8 * -dVar18) | (ulong)-dVar18 & auVar16._0_8_);
  dVar17 = (double)(~auVar16._8_8_ & (ulong)(dVar8 * -dVar19) | (ulong)-dVar19 & auVar16._8_8_);
  dVar9 = rkQ1->w;
  dVar11 = rkQ1->x;
  dVar12 = rkQ1->y;
  dVar18 = rkQ1->y;
  dVar19 = rkQ1->z;
  dVar8 = rkQ1->z;
  rkB->w = (-dVar12 * dVar13 + dVar10 * dVar9 + -dVar11 * dVar7) - dVar8 * dVar17;
  rkB->x = (dVar12 * dVar17 + dVar7 * dVar9 + dVar11 * dVar10) - dVar8 * dVar13;
  rkB->y = (dVar7 * dVar8 + dVar9 * dVar13 + dVar10 * dVar18) - dVar17 * dVar11;
  rkB->z = (dVar13 * dVar11 + dVar9 * dVar17 + dVar10 * dVar19) - dVar7 * dVar12;
  return;
}

Assistant:

void Quaternion::intermediate ( const Quaternion& rkQ0,
                                        const Quaternion& rkQ1, const Quaternion& rkQ2,
                                        Quaternion& rkA, Quaternion& rkB )
        {
            // assert:  q0, q1, q2 are unit quaternions

            Quaternion kQ0inv = rkQ0.unitInverse();
            Quaternion kQ1inv = rkQ1.unitInverse();
            Quaternion rkP0 = kQ0inv * rkQ1;
            Quaternion rkP1 = kQ1inv * rkQ2;
            Quaternion kArg = 0.25 * ( rkP0.log() - rkP1.log() );
            Quaternion kMinusArg = -kArg;

            rkA = rkQ1 * kArg.exp();
            rkB = rkQ1 * kMinusArg.exp();
        }